

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.h
# Opt level: O0

void __thiscall DIS::DataStream::WriteAlgorithm<short>(DataStream *this,short t)

{
  char *ch;
  DataStream *pDStack_10;
  short t_local;
  DataStream *this_local;
  
  ch._6_2_ = t;
  pDStack_10 = this;
  DoFlip(this,(char *)((long)&ch + 6),2);
  DoWrite(this,(char *)((long)&ch + 6),2);
  IncrementPointer<short,unsigned_long>(this,&this->_write_pos);
  return;
}

Assistant:

void WriteAlgorithm(T t)
      {
         char* ch = reinterpret_cast<char*>( &t );
         DoFlip( ch , sizeof(T) );
         DoWrite( ch , sizeof(T) );
         IncrementPointer<T>( _write_pos );
      }